

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * ra_get_container(roaring_array_t *ra,uint16_t x,uint8_t *typecode)

{
  int32_t iVar1;
  int i;
  uint8_t *typecode_local;
  uint16_t x_local;
  roaring_array_t *ra_local;
  
  iVar1 = binarySearch(ra->keys,ra->size,x);
  if (iVar1 < 0) {
    ra_local = (roaring_array_t *)0x0;
  }
  else {
    *typecode = ra->typecodes[iVar1];
    ra_local = (roaring_array_t *)ra->containers[iVar1];
  }
  return ra_local;
}

Assistant:

container_t *ra_get_container(
    roaring_array_t *ra, uint16_t x, uint8_t *typecode
){
    int i = binarySearch(ra->keys, (int32_t)ra->size, x);
    if (i < 0) return NULL;
    *typecode = ra->typecodes[i];
    return ra->containers[i];
}